

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_integral_span
          (basic_substring<const_char> *this,size_t skip_start)

{
  byte bVar1;
  code *pcVar2;
  error_flags eVar3;
  uint uVar4;
  ulong uVar6;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t len_;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  basic_substring<const_char> bVar13;
  basic_substring<const_char> local_40;
  char *pcVar5;
  
  if ((this->len == 0) || (this->str == (char *)0x0)) {
    basic_substring<char_const>::_first_integral_span();
    in_RDX = extraout_RDX;
  }
  if (this->len == skip_start) {
    pcVar5 = this->str;
    in_RDX = 0;
    goto LAB_001b8aa5;
  }
  if (this->len <= skip_start) {
    basic_substring<char_const>::_first_integral_span();
    in_RDX = extraout_RDX_00;
  }
  pcVar5 = (char *)(skip_start + 3);
  if (pcVar5 <= (char *)this->len) {
    pcVar5 = this->str;
    if (pcVar5[skip_start] == '0') {
      uVar4 = (byte)pcVar5[skip_start + 1] & 0xffffffdf;
      pcVar5 = (char *)(ulong)uVar4;
      if (uVar4 == 0x42) {
        uVar8 = skip_start + 2;
        uVar6 = this->len;
        bVar9 = uVar8 < uVar6;
        if (bVar9) {
          uVar7 = uVar8;
          do {
            bVar1 = this->str[uVar7];
            if ((bVar1 & 0xfe) != 0x30) {
              if ((uVar8 < uVar7) &&
                 (((uVar4 = (uint)bVar1, bVar1 < 0x3c &&
                   ((0x800120100002601U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) ||
                  ((uVar4 == 0x7d || (uVar4 == 0x5d)))))) {
                if (uVar6 < uVar7) {
                  eVar3 = get_error_flags();
                  if (((eVar3 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                    pcVar2 = (code *)swi(3);
                    bVar13 = (basic_substring<const_char>)(*pcVar2)();
                    return bVar13;
                  }
                  handle_error(0x21a325,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x154e,"num <= len || num == npos");
                }
                basic_substring(&local_40,this->str,uVar7);
                pcVar5 = local_40.str;
                in_RDX = local_40.len;
              }
              else {
                in_RDX = 0;
                pcVar5 = this->str;
              }
            }
            if ((bVar1 & 0xfe) != 0x30) break;
            uVar7 = uVar7 + 1;
            uVar6 = this->len;
            bVar9 = uVar7 < uVar6;
          } while (bVar9);
        }
joined_r0x001b8abb:
        if (!bVar9) {
          pcVar5 = this->str;
          in_RDX = this->len;
        }
        skip_start = skip_start + 2;
        bVar9 = false;
      }
      else {
        if (uVar4 == 0x4f) {
          uVar8 = skip_start + 2;
          uVar6 = this->len;
          bVar9 = uVar8 < uVar6;
          if (bVar9) {
            uVar7 = uVar8;
            do {
              bVar1 = this->str[uVar7];
              if ((bVar1 & 0xf8) != 0x30) {
                if ((uVar8 < uVar7) &&
                   ((((uVar4 = (uint)bVar1, bVar1 < 0x3c &&
                      ((0x800120100002601U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) || (uVar4 == 0x7d))
                    || (uVar4 == 0x5d)))) {
                  if (uVar6 < uVar7) {
                    eVar3 = get_error_flags();
                    if (((eVar3 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                      pcVar2 = (code *)swi(3);
                      bVar13 = (basic_substring<const_char>)(*pcVar2)();
                      return bVar13;
                    }
                    handle_error(0x21a325,
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 ,0x154e,"num <= len || num == npos");
                  }
                  basic_substring(&local_40,this->str,uVar7);
                  pcVar5 = local_40.str;
                  in_RDX = local_40.len;
                }
                else {
                  in_RDX = 0;
                  pcVar5 = this->str;
                }
              }
              if ((bVar1 & 0xf8) != 0x30) break;
              uVar7 = uVar7 + 1;
              uVar6 = this->len;
              bVar9 = uVar7 < uVar6;
            } while (bVar9);
          }
          goto joined_r0x001b8abb;
        }
        if (uVar4 == 0x58) {
          uVar8 = skip_start + 2;
          uVar6 = this->len;
          bVar9 = uVar8 < uVar6;
          if (bVar9) {
            uVar7 = uVar8;
            do {
              bVar1 = this->str[uVar7];
              bVar10 = 9 < (byte)(bVar1 - 0x30);
              bVar11 = 5 < (byte)(bVar1 + 0x9f);
              bVar12 = 5 < (byte)(bVar1 + 0xbf);
              if ((bVar11 && bVar10) && bVar12) {
                if ((uVar8 < uVar7) &&
                   (((bVar1 < 0x3c && ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)
                     ) || ((bVar1 == 0x7d || (bVar1 == 0x5d)))))) {
                  if (uVar6 < uVar7) {
                    eVar3 = get_error_flags();
                    if (((eVar3 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                      pcVar2 = (code *)swi(3);
                      bVar13 = (basic_substring<const_char>)(*pcVar2)();
                      return bVar13;
                    }
                    handle_error(0x21a325,
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 ,0x154e,"num <= len || num == npos");
                  }
                  basic_substring(&local_40,this->str,uVar7);
                  pcVar5 = local_40.str;
                  in_RDX = local_40.len;
                }
                else {
                  in_RDX = 0;
                  pcVar5 = this->str;
                }
              }
              if ((bVar11 && bVar10) && bVar12) break;
              uVar7 = uVar7 + 1;
              uVar6 = this->len;
              bVar9 = uVar7 < uVar6;
            } while (bVar9);
          }
          goto joined_r0x001b8abb;
        }
        bVar9 = true;
      }
      if (!bVar9) goto LAB_001b8aa5;
    }
    else {
      uVar6 = this->len;
      bVar9 = skip_start < uVar6;
      if (skip_start < uVar6) {
        len_ = skip_start;
        do {
          bVar1 = this->str[len_];
          if (9 < (byte)(bVar1 - 0x30)) {
            if ((skip_start < len_) &&
               ((((bVar1 < 0x3c && ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
                 || (bVar1 == 0x7d)) || (bVar1 == 0x5d)))) {
              if (uVar6 < len_) {
                eVar3 = get_error_flags();
                if (((eVar3 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                  pcVar2 = (code *)swi(3);
                  bVar13 = (basic_substring<const_char>)(*pcVar2)();
                  return bVar13;
                }
                handle_error(0x21a325,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x154e,"num <= len || num == npos");
              }
              basic_substring(&local_40,this->str,len_);
              pcVar5 = local_40.str;
              in_RDX = local_40.len;
            }
            else {
              in_RDX = 0;
              pcVar5 = this->str;
            }
          }
          if (9 < (byte)(bVar1 - 0x30)) break;
          len_ = len_ + 1;
          uVar6 = this->len;
          bVar9 = len_ < uVar6;
        } while (bVar9);
      }
      if (bVar9) goto LAB_001b8aa5;
    }
  }
  uVar6 = this->len;
  bVar9 = skip_start < uVar6;
  if (bVar9) {
    uVar8 = skip_start;
    do {
      bVar1 = this->str[uVar8];
      if (9 < (byte)(bVar1 - 0x30)) {
        if ((skip_start < uVar8) &&
           ((((bVar1 < 0x3c && ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) ||
             (bVar1 == 0x7d)) || (bVar1 == 0x5d)))) {
          if (uVar6 < uVar8) {
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar2 = (code *)swi(3);
              bVar13 = (basic_substring<const_char>)(*pcVar2)();
              return bVar13;
            }
            handle_error(0x21a325,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x154e,"num <= len || num == npos");
          }
          basic_substring(&local_40,this->str,uVar8);
          pcVar5 = local_40.str;
          in_RDX = local_40.len;
        }
        else {
          in_RDX = 0;
          pcVar5 = this->str;
        }
      }
      if (9 < (byte)(bVar1 - 0x30)) break;
      uVar8 = uVar8 + 1;
      uVar6 = this->len;
      bVar9 = uVar8 < uVar6;
    } while (bVar9);
  }
  if (!bVar9) {
    pcVar5 = this->str;
    in_RDX = this->len;
  }
LAB_001b8aa5:
  bVar13.len = in_RDX;
  bVar13.str = pcVar5;
  return bVar13;
}

Assistant:

basic_substring _first_integral_span(size_t skip_start) const
    {
        C4_ASSERT(!empty());
        if(skip_start == len)
            return first(0);
        C4_ASSERT(skip_start < len);
        if(len >= skip_start + 3)
        {
            if(str[skip_start] != '0')
            {
                for(size_t i = skip_start; i < len; ++i)
                {
                    char c = str[i];
                    if(c < '0' || c > '9')
                        return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                }
            }
            else
            {
                char next = str[skip_start + 1];
                if(next == 'x' || next == 'X')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if( ! _is_hex_char(c))
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
                else if(next == 'b' || next == 'B')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if(c != '0' && c != '1')
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
                else if(next == 'o' || next == 'O')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if(c < '0' || c > '7')
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
            }
        }
        // must be a decimal, or it is not a an number
        for(size_t i = skip_start; i < len; ++i)
        {
            const char c = str[i];
            if(c < '0' || c > '9')
                return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
        }
        return *this;
    }